

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_server_discovery.c
# Opt level: O0

void psd_add_gws(pcp_ctx_t *ctx)

{
  uint32_t uVar1;
  sockaddr_in6 *ctx_00;
  uint16_t port;
  uint32_t uVar2;
  int pcp_server_index;
  pcp_errno pVar3;
  pcp_server_t *ppVar4;
  bool bVar5;
  char *local_90;
  char *local_88;
  pcp_server_t *s;
  in6_addr *__a_2;
  in6_addr *__a_1;
  in6_addr *__a;
  int pcps_indx;
  int rcount;
  sockaddr_in6 *gw;
  sockaddr_in6 *gws;
  pcp_ctx_t *ctx_local;
  
  gw = (sockaddr_in6 *)0x0;
  gws = (sockaddr_in6 *)ctx;
  __a._4_4_ = getgateways(&gw);
  _pcps_indx = gw;
  for (; 0 < __a._4_4_; __a._4_4_ = __a._4_4_ + -1) {
    bVar5 = false;
    if (((_pcps_indx->sin6_addr).__in6_u.__u6_addr32[0] == 0) &&
       (bVar5 = false, (_pcps_indx->sin6_addr).__in6_u.__u6_addr32[1] == 0)) {
      uVar1 = (_pcps_indx->sin6_addr).__in6_u.__u6_addr32[2];
      uVar2 = htonl(0xffff);
      bVar5 = uVar1 == uVar2;
    }
    if ((!bVar5) || ((_pcps_indx->sin6_addr).__in6_u.__u6_addr32[3] != 0)) {
      bVar5 = false;
      if (((_pcps_indx->sin6_addr).__in6_u.__u6_addr32[0] == 0) &&
         ((bVar5 = false, (_pcps_indx->sin6_addr).__in6_u.__u6_addr32[1] == 0 &&
          (bVar5 = false, (_pcps_indx->sin6_addr).__in6_u.__u6_addr32[2] == 0)))) {
        bVar5 = (_pcps_indx->sin6_addr).__in6_u.__u6_addr32[3] == 0;
      }
      if (!bVar5) {
        bVar5 = false;
        if (((_pcps_indx->sin6_addr).__in6_u.__u6_addr32[0] == 0) &&
           (bVar5 = false, (_pcps_indx->sin6_addr).__in6_u.__u6_addr32[1] == 0)) {
          uVar1 = (_pcps_indx->sin6_addr).__in6_u.__u6_addr32[2];
          uVar2 = htonl(0xffff);
          bVar5 = uVar1 == uVar2;
        }
        if (((((!bVar5) || ((_pcps_indx->sin6_addr).__in6_u.__u6_addr8[0xc] != '\0')) ||
             ((_pcps_indx->sin6_addr).__in6_u.__u6_addr8[0xd] != '\0')) ||
            (((_pcps_indx->sin6_addr).__in6_u.__u6_addr8[0xe] != '\0' ||
             ((_pcps_indx->sin6_addr).__in6_u.__u6_addr8[0xf] != '\0')))) &&
           (ppVar4 = get_pcp_server_by_ip
                               ((pcp_ctx_t *)gws,&_pcps_indx->sin6_addr,_pcps_indx->sin6_scope_id),
           ctx_00 = gws, ppVar4 == (pcp_server_t *)0x0)) {
          port = ntohs(0x14e7);
          pcp_server_index =
               pcp_new_server((pcp_ctx_t *)ctx_00,&_pcps_indx->sin6_addr,port,
                              _pcps_indx->sin6_scope_id);
          if ((-1 < pcp_server_index) &&
             (ppVar4 = get_pcp_server((pcp_ctx_t *)gws,pcp_server_index),
             ppVar4 != (pcp_server_t *)0x0)) {
            pVar3 = psd_fill_pcp_server_src(ppVar4);
            if (pVar3 == PCP_ERR_SUCCESS) {
              if (ppVar4 == (pcp_server_t *)0x0) {
                local_90 = "NULL pointer!!!";
              }
              else {
                local_90 = ppVar4->pcp_server_paddr;
              }
              pcp_logger(PCP_LOGLVL_INFO,"Found gateway %s. Added as possible PCP server.",local_90)
              ;
            }
            else {
              if (ppVar4 == (pcp_server_t *)0x0) {
                local_88 = "NULL pointer!!!";
              }
              else {
                local_88 = ppVar4->pcp_server_paddr;
              }
              pcp_logger(PCP_LOGLVL_ERR,"Failed to initialize gateway %s as a PCP server.",local_88)
              ;
            }
          }
        }
      }
    }
    _pcps_indx = _pcps_indx + 1;
  }
  free(gw);
  return;
}

Assistant:

void psd_add_gws(pcp_ctx_t *ctx) {
    struct sockaddr_in6 *gws = NULL, *gw;
    int rcount = getgateways(&gws);

    gw = gws;

    for (; rcount > 0; rcount--, gw++) {
        int pcps_indx;

        if ((IN6_IS_ADDR_V4MAPPED(&gw->sin6_addr)) &&
            (S6_ADDR32(&gw->sin6_addr)[3] == INADDR_ANY))
            continue;

        if (IPV6_IS_ADDR_ANY(&gw->sin6_addr))
            continue;

        if (get_pcp_server_by_ip(ctx, &gw->sin6_addr, gw->sin6_scope_id))
            continue;

        pcps_indx = pcp_new_server(ctx, &gw->sin6_addr, ntohs(PCP_SERVER_PORT),
                                   gw->sin6_scope_id);
        if (pcps_indx >= 0) {
            pcp_server_t *s = get_pcp_server(ctx, pcps_indx);
            if (!s)
                continue;

            if (psd_fill_pcp_server_src(s)) {
                PCP_LOG(PCP_LOGLVL_ERR,
                        "Failed to initialize gateway %s as a PCP server.",
                        s ? s->pcp_server_paddr : "NULL pointer!!!");
            } else {
                PCP_LOG(PCP_LOGLVL_INFO,
                        "Found gateway %s. "
                        "Added as possible PCP server.",
                        s ? s->pcp_server_paddr : "NULL pointer!!!");
            }
        }
    }
    free(gws);
}